

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * util::trim(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  long lVar2;
  allocator<char> local_29;
  
  lVar1 = std::__cxx11::string::find_first_not_of((char *)str,0x186ae0);
  lVar2 = std::__cxx11::string::find_last_not_of((char *)str,0x186ae0);
  if ((lVar2 == -1) && (lVar1 == -1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_29);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string &str)
{
	std::size_t si, ei;
	bool notfound = false;

	si = str.find_first_not_of(" \t\n\r");
	if (si == std::string::npos)
	{
		si = 0;
		notfound = true;
	}

	ei = str.find_last_not_of(" \t\n\r");
	if (ei == std::string::npos)
	{
		if (notfound)
		{
			return "";
		}
		ei = str.length()-1;
	}
	++ei;

	return str.substr(si, ei - si);
}